

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v6::detail::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  bigint *lhs2;
  ulong uVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  bigint denominator;
  bigint *local_320;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00203c88;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00203c88;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00203c88;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_320 = &local_190;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00203c88;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  uVar9 = (ulong)d & 0xfffffffffffff;
  uVar5 = (uint)((ulong)d >> 0x34) & 0x7ff;
  uVar10 = uVar9 + 0x10000000000000;
  if (uVar5 == 0) {
    uVar10 = uVar9;
  }
  iVar7 = -0x432;
  if (uVar5 != 0) {
    iVar7 = uVar5 - 0x433;
  }
  bVar14 = uVar9 == 0;
  bVar13 = 1 < uVar5;
  iVar12 = (bVar13 && bVar14) + 1;
  uVar9 = uVar10 << (sbyte)iVar12;
  if (iVar7 < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_2f0,-*exp10);
      sVar2 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      if (local_240.bigits_.super_buffer<unsigned_int>.capacity_ <
          local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
        (**local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                  (&local_240,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
      }
      local_240.bigits_.super_buffer<unsigned_int>.size_ = sVar2;
      if (local_2f0.bigits_.super_buffer<unsigned_int>.size_ != 0) {
        memmove(local_240.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2f0.bigits_.super_buffer<unsigned_int>.size_ << 2);
      }
      sVar2 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      local_240.exp_ = local_2f0.exp_;
      if (bVar13 && bVar14) {
        if (local_190.bigits_.super_buffer<unsigned_int>.capacity_ <
            local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
          (**local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                    (&local_190,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
        }
        local_190.bigits_.super_buffer<unsigned_int>.size_ = sVar2;
        if (local_2f0.bigits_.super_buffer<unsigned_int>.size_ != 0) {
          memmove(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2f0.bigits_.super_buffer<unsigned_int>.size_ << 2);
        }
        local_320 = &local_190;
        local_190.exp_ = local_2f0.exp_;
        bigint::operator<<=(local_320,1);
      }
      else {
        local_320 = (bigint *)0x0;
      }
      bigint::operator*=(&local_2f0,uVar9);
      *local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_e0.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_e0,1);
      }
      local_e0.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_e0.exp_ = 0;
      bigint::operator<<=(&local_e0,iVar12 - iVar7);
    }
    else {
      uVar3 = 0xffffffffffffffff;
      do {
        uVar8 = uVar3;
        local_2f0.bigits_.store_[uVar8 + 1] = (uint)uVar9;
        uVar9 = uVar9 >> 0x20;
        uVar3 = uVar8 + 1;
      } while (uVar9 != 0);
      if (0x1f < uVar8 + 1) {
        basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
                  (&local_2f0.bigits_,uVar8 + 2);
      }
      local_2f0.exp_ = 0;
      local_2f0.bigits_.super_buffer<unsigned_int>.size_ = uVar8 + 2;
      bigint::assign_pow10(&local_e0,*exp10);
      bigint::operator<<=(&local_e0,iVar12 - iVar7);
      *local_240.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_240.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_240,1);
      }
      local_240.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_240.exp_ = 0;
      if (bVar13 && bVar14) {
        *local_190.bigits_.super_buffer<unsigned_int>.ptr_ = 2;
        if (local_190.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
          (**local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_190,1);
        }
        local_190.bigits_.super_buffer<unsigned_int>.size_ = 1;
        local_190.exp_ = 0;
      }
      else {
        local_320 = (bigint *)0x0;
      }
    }
  }
  else {
    uVar3 = 0xffffffffffffffff;
    do {
      uVar8 = uVar3;
      local_2f0.bigits_.store_[uVar8 + 1] = (uint)uVar9;
      uVar9 = uVar9 >> 0x20;
      uVar3 = uVar8 + 1;
    } while (uVar9 != 0);
    if (0x1f < uVar8 + 1) {
      basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
                (&local_2f0.bigits_,uVar8 + 2);
    }
    local_2f0.exp_ = 0;
    local_2f0.bigits_.super_buffer<unsigned_int>.size_ = uVar8 + 2;
    bigint::operator<<=(&local_2f0,iVar7);
    *local_240.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
    if (local_240.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
      (**local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_240,1);
    }
    local_240.bigits_.super_buffer<unsigned_int>.size_ = 1;
    local_240.exp_ = 0;
    bigint::operator<<=(&local_240,iVar7);
    if (bVar13 && bVar14) {
      *local_190.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_190.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_190,1);
      }
      local_320 = &local_190;
      local_190.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_190.exp_ = 0;
      bigint::operator<<=(local_320,iVar7 + 1);
    }
    else {
      local_320 = (bigint *)0x0;
    }
    bigint::assign_pow10(&local_e0,*exp10);
    bigint::operator<<=(&local_e0,1);
  }
  lhs2 = local_320;
  if (local_320 == (bigint *)0x0) {
    lhs2 = &local_240;
  }
  pcVar1 = buf->ptr_;
  uVar5 = ~(uint)uVar10 & 1;
  lVar11 = 0;
  while( true ) {
    uVar6 = bigint::divmod_assign(&local_2f0,&local_e0);
    iVar7 = compare(&local_2f0,&local_240);
    iVar12 = add_compare(&local_2f0,lhs2,&local_e0);
    pcVar1[lVar11] = (char)uVar6 + '0';
    if ((iVar7 < (int)uVar5) || ((int)-uVar5 < iVar12)) break;
    bigint::multiply(&local_2f0,10);
    bigint::multiply(&local_240,10);
    if (local_320 != (bigint *)0x0) {
      bigint::multiply(lhs2,10);
    }
    lVar11 = lVar11 + 1;
  }
  if (iVar7 < (int)uVar5) {
    if (iVar12 <= (int)-uVar5) goto LAB_0018608a;
    iVar7 = add_compare(&local_2f0,&local_2f0,&local_e0);
    if ((iVar7 < 1) && ((uVar6 & 1) == 0 || iVar7 != 0)) goto LAB_0018608a;
    cVar4 = pcVar1[lVar11] + '\x01';
  }
  else {
    cVar4 = (char)uVar6 + '1';
  }
  pcVar1[lVar11] = cVar4;
LAB_0018608a:
  uVar10 = lVar11 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar10) {
    (**buf->_vptr_buffer)(buf,uVar10);
  }
  buf->size_ = uVar10;
  *exp10 = *exp10 - (int)lVar11;
  bigint::~bigint(&local_190);
  bigint::~bigint(&local_240);
  bigint::~bigint(&local_e0);
  bigint::~bigint(&local_2f0);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}